

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O3

void dlib::tt::dot_prods(bool add_to,tensor *out,tensor *lhs,tensor *rhs)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000039;
  ulong uVar4;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  undefined1 **local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  
  if ((int)CONCAT71(in_register_00000039,add_to) == 0) {
    uVar4 = lhs->m_size;
    if (uVar4 == 0) {
      local_78 = 0;
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = lhs->m_n;
      uVar2 = uVar4 / uVar3;
      iVar1 = (*lhs->_vptr_tensor[2])(lhs,lhs->_vptr_tensor,uVar4 % uVar3);
      local_78 = CONCAT44(extraout_var_00,iVar1);
    }
    local_70 = uVar3;
    local_68 = uVar2;
    local_60 = uVar2;
    if (rhs->m_size == 0) {
      local_40 = 0;
      uVar4 = 0;
      uVar3 = 0;
    }
    else {
      uVar4 = rhs->m_n;
      uVar3 = (ulong)rhs->m_size / uVar4;
      iVar1 = (*rhs->_vptr_tensor[2])(rhs);
      local_40 = CONCAT44(extraout_var_02,iVar1);
    }
    local_48 = &local_40;
    local_58 = &local_50;
    local_50 = (undefined1 *)&local_78;
    local_38 = uVar4;
    local_30 = uVar3;
    local_28 = uVar3;
    tensor::operator=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                           *)&local_58);
  }
  else {
    uVar4 = lhs->m_size;
    if (uVar4 == 0) {
      local_78 = 0;
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = lhs->m_n;
      uVar2 = uVar4 / uVar3;
      iVar1 = (*lhs->_vptr_tensor[2])(lhs,lhs->_vptr_tensor,uVar4 % uVar3);
      local_78 = CONCAT44(extraout_var,iVar1);
    }
    local_70 = uVar3;
    local_68 = uVar2;
    local_60 = uVar2;
    if (rhs->m_size == 0) {
      local_40 = 0;
      uVar4 = 0;
      uVar3 = 0;
    }
    else {
      uVar4 = rhs->m_n;
      uVar3 = (ulong)rhs->m_size / uVar4;
      iVar1 = (*rhs->_vptr_tensor[2])(rhs);
      local_40 = CONCAT44(extraout_var_01,iVar1);
    }
    local_48 = &local_40;
    local_58 = &local_50;
    local_50 = (undefined1 *)&local_78;
    local_38 = uVar4;
    local_30 = uVar3;
    local_28 = uVar3;
    tensor::operator+=(out,(matrix_exp<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_pointwise_multiply<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>
                            *)&local_58);
  }
  return;
}

Assistant:

void dot_prods (
        bool add_to,
        tensor& out,
        const tensor& lhs,
        const tensor& rhs
    )
    {
#ifdef DLIB_USE_CUDA
        cuda::dot_prods(add_to, out, lhs, rhs);
#else
        if (add_to)
            out += sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
        else
            out = sum_cols(pointwise_multiply(mat(lhs), mat(rhs))); 
#endif
    }